

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetBXPortStatus(ndicapi *pol,int portHandle)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  bVar1 = pol->BxHandleCount;
  iVar2 = 0;
  uVar3 = 0;
  if (bVar1 != 0) {
    uVar3 = 0;
    while (pol->BxHandles[uVar3] != portHandle) {
      uVar3 = uVar3 + 1;
      if ((uint)bVar1 == uVar3) {
        return 0;
      }
    }
  }
  if ((uint)uVar3 != (uint)bVar1) {
    iVar2 = pol->BxPortStatus[uVar3 & 0xffffffff];
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetBXPortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxPortStatus[i];
}